

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingModeIterativeComplete(Federate *this)

{
  Modes MVar1;
  undefined8 uVar2;
  char *in_RDI;
  exception *anon_var_0;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff98;
  Modes newMode;
  undefined7 in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_20;
  
  MVar1 = CLI::std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  if (MVar1 != STARTUP) {
    if (MVar1 != PENDING_ITERATIVE_INIT) {
      uVar2 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(MVar1,in_stack_ffffffffffffffb0),in_RDI);
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)CONCAT17(MVar1,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffb8);
      __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x21dbed);
    newMode = (Modes)((ulong)in_RDI >> 0x38);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff98);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_20);
    std::future<void>::get((future<void> *)CONCAT17(MVar1,in_stack_ffffffffffffffb0));
    updateFederateMode((Federate *)CONCAT17(MVar1,in_stack_ffffffffffffffb0),newMode);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x21dc8d);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeIterativeComplete()
{
    switch (currentMode.load()) {
        case Modes::PENDING_ITERATIVE_INIT: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                asyncInfo->initIterativeFuture.get();
                updateFederateMode(Modes::STARTUP);
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        } break;
        case Modes::STARTUP:
            // odd call since it would do nothing but not an error
            break;
        default:
            throw(InvalidFunctionCall(
                "cannot call enterInitializingModeIterativeComplete function without first calling "
                "enterInitializingModeIterativeAsync function "));
    }
}